

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_main_loop__pulse(ma_device *pDevice)

{
  ma_device_type mVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  ma_result mVar5;
  uint uVar6;
  uint uVar7;
  ma_uint32 mVar8;
  ma_result mVar9;
  ma_pa_operation *pOP;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  ma_uint32 capturedDeviceFramesToProcess;
  ma_uint64 convertedDeviceFrameCount;
  ma_uint64 convertedClientFrameCount;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_uint8 capturedDeviceData [4096];
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 capturedClientData [4096];
  ma_uint8 playbackClientData [4096];
  int local_4080;
  uint local_407c;
  ulong local_4070;
  ma_result local_4064;
  int local_4060;
  uint local_405c;
  ulong local_4058;
  ulong local_4050;
  ulong local_4048;
  ma_data_converter *local_4040;
  undefined1 local_4038 [4096];
  ma_uint32 local_3038 [1024];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4eab,"ma_result ma_device_main_loop__pulse(ma_device *)");
  }
  if ((((pDevice->type & ~ma_device_type_playback) != ma_device_type_capture) ||
      (mVar5 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,0), mVar5 == 0)) &&
     (((pDevice->type | ma_device_type_capture) != ma_device_type_duplex ||
      (mVar5 = ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,0), mVar5 == 0)))) {
    mVar5 = 0;
    if (pDevice->state == 2) {
      local_4040 = &(pDevice->capture).converter;
      mVar5 = 0;
      bVar12 = false;
      do {
        mVar1 = pDevice->type;
        bVar4 = bVar12;
        if (mVar1 == ma_device_type_playback) {
          uVar10 = (pDevice->playback).internalPeriodSizeInFrames;
          uVar7 = (uint)(0x1000 / (ulong)((&DAT_001157a0)[(pDevice->playback).internalFormat] *
                                         (pDevice->playback).internalChannels));
          if (uVar10 != 0) {
            uVar11 = 0;
            do {
              mVar8 = uVar10 - uVar11;
              if (uVar7 <= uVar10 - uVar11) {
                mVar8 = uVar7;
              }
              ma_device__read_frames_from_client(pDevice,mVar8,local_4038);
              mVar5 = ma_device_write__pulse(pDevice,local_4038,mVar8,local_3038);
              mVar8 = 0;
              if (mVar5 == 0) {
                mVar8 = local_3038[0];
              }
              bVar4 = true;
            } while ((mVar5 == 0) && (uVar11 = uVar11 + mVar8, bVar4 = bVar12, uVar11 < uVar10));
          }
        }
        else if (mVar1 == ma_device_type_capture) {
          uVar10 = (pDevice->capture).internalPeriodSizeInFrames;
          uVar7 = (uint)(0x1000 / (ulong)((&DAT_001157a0)[(pDevice->capture).internalFormat] *
                                         (pDevice->capture).internalChannels));
          if (uVar10 != 0) {
            uVar11 = 0;
            do {
              mVar8 = uVar10 - uVar11;
              if (uVar7 <= uVar10 - uVar11) {
                mVar8 = uVar7;
              }
              mVar5 = ma_device_read__pulse(pDevice,local_4038,mVar8,local_3038);
              if (mVar5 != 0) {
                bVar4 = true;
                break;
              }
              ma_device__send_frames_to_client(pDevice,local_3038[0],local_4038);
              uVar11 = uVar11 + local_3038[0];
            } while (uVar11 < uVar10);
          }
        }
        else if (mVar1 == ma_device_type_duplex) {
          uVar10 = (pDevice->capture).internalPeriodSizeInFrames;
          uVar7 = (pDevice->playback).internalPeriodSizeInFrames;
          if (uVar10 < uVar7) {
            uVar7 = uVar10;
          }
          if (uVar7 != 0) {
            uVar10 = 0;
            do {
              mVar8 = (pDevice->playback).internalChannels;
              iVar2 = (&DAT_001157a0)[(pDevice->playback).internalFormat];
              uVar6 = (uint)(0x1000 / (ulong)((&DAT_001157a0)[(pDevice->capture).internalFormat] *
                                             (pDevice->capture).internalChannels));
              uVar11 = uVar7 - uVar10;
              if (uVar6 <= uVar7 - uVar10) {
                uVar11 = uVar6;
              }
              mVar5 = ma_device_read__pulse(pDevice,local_4038,uVar11,&local_405c);
              if (mVar5 == 0) {
                local_4080 = 0;
                local_407c = local_405c;
                local_4064 = mVar5;
                do {
                  mVar5 = 0;
                  uVar3 = 0x1000 / (ulong)((&DAT_001157a0)[(pDevice->capture).format] *
                                          (pDevice->capture).channels);
                  local_4070 = 0x1000 / (ulong)((&DAT_001157a0)[(pDevice->playback).format] *
                                               (pDevice->playback).channels);
                  if ((uint)uVar3 < (uint)local_4070) {
                    local_4070 = uVar3;
                  }
                  local_4048 = (ulong)local_407c;
                  mVar9 = ma_data_converter_process_pcm_frames
                                    (local_4040,
                                     local_4038 +
                                     (pDevice->capture).internalChannels * local_4080 *
                                     (&DAT_001157a0)[(pDevice->capture).internalFormat],&local_4048,
                                     local_2038,&local_4070);
                  if (mVar9 == 0) {
                    if (local_4070 == 0) {
                      bVar12 = false;
                    }
                    else {
                      ma_device__on_data(pDevice,local_1038,local_2038,(ma_uint32)local_4070);
                      local_4060 = (int)local_4048;
                      local_4080 = local_4080 + (int)local_4048;
                      do {
                        local_4050 = local_4070;
                        local_4058 = 0x1000 / (ulong)(iVar2 * mVar8);
                        mVar5 = ma_data_converter_process_pcm_frames
                                          (&(pDevice->playback).converter,local_1038,&local_4050,
                                           local_3038,&local_4058);
                        if (mVar5 == 0) {
                          mVar5 = 0;
                          mVar9 = ma_device_write__pulse
                                            (pDevice,local_3038,(ma_uint32)local_4058,
                                             (ma_uint32 *)0x0);
                          if (mVar9 == 0) {
                            local_4070 = local_4070 - (local_4050 & 0xffffffff);
                            bVar12 = local_4070 != 0;
                          }
                          else {
                            bVar4 = true;
                            bVar12 = false;
                            mVar5 = mVar9;
                          }
                        }
                        else {
                          bVar12 = false;
                        }
                      } while (bVar12);
                      local_407c = local_407c - local_4060;
                      bVar12 = mVar5 == 0;
                      if (!bVar12) {
                        bVar4 = true;
                      }
                    }
                  }
                  else {
                    bVar12 = false;
                    mVar5 = mVar9;
                  }
                } while (bVar12);
                uVar10 = uVar10 + local_4080;
                mVar9 = local_4064;
              }
              else {
                bVar4 = true;
                mVar9 = mVar5;
              }
            } while ((mVar9 == 0) && (uVar10 < uVar7));
          }
        }
      } while ((pDevice->state == 2) && (bVar12 = bVar4, !bVar4));
    }
    if ((((pDevice->type & ~ma_device_type_playback) != ma_device_type_capture) ||
        (mVar9 = ma_device__cork_stream__pulse(pDevice,ma_device_type_capture,1), mVar9 == 0)) &&
       ((pDevice->type | ma_device_type_capture) == ma_device_type_duplex)) {
      pOP = (ma_pa_operation *)
            (*(pDevice->pContext->field_21).alsa.snd_pcm_state)
                      ((pDevice->field_23).pulse.pStreamPlayback,
                       ma_pulse_operation_complete_callback,local_4038);
      if (pOP != (ma_pa_operation *)0x0) {
        ma_wait_for_operation__pulse
                  (pDevice->pContext,
                   (ma_pa_mainloop *)(pDevice->field_23).null_device.deviceThread.pContext,pOP);
        (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP);
      }
      ma_device__cork_stream__pulse(pDevice,ma_device_type_playback,1);
    }
  }
  return mVar5;
}

Assistant:

static ma_result ma_device_main_loop__pulse(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* The stream needs to be uncorked first. We do this at the top for both capture and playback for PulseAudio. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_capture, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        result = ma_device__cork_stream__pulse(pDevice, ma_device_type_playback, 0);
        if (result != MA_SUCCESS) {
            return result;
        }
    }


    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                /* The process is: device_read -> convert -> callback -> convert -> device_write */
                ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                    ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                    ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 capturedDeviceFramesRemaining;
                    ma_uint32 capturedDeviceFramesProcessed;
                    ma_uint32 capturedDeviceFramesToProcess;
                    ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                    if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                        capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                    capturedDeviceFramesProcessed = 0;

                    for (;;) {
                        ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                        ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                        ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                        ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                        ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                        /* Convert capture data from device format to client format. */
                        result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        /*
                        If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                        which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                        */
                        if (capturedClientFramesToProcessThisIteration == 0) {
                            break;
                        }

                        ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                        capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                        capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                        /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                        for (;;) {
                            ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                            ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            result = ma_device_write__pulse(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);   /* Safe cast. */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }

                            capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }
                        }

                        /* In case an error happened from ma_device_write__pulse()... */
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }
                    }

                    totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                }
            } break;

            case ma_device_type_capture:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                ma_uint32 framesReadThisPeriod = 0;
                while (framesReadThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                    if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                        framesToReadThisIteration = intermediaryBufferSizeInFrames;
                    }

                    result = ma_device_read__pulse(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                    framesReadThisPeriod += framesProcessed;
                }
            } break;

            case ma_device_type_playback:
            {
                ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                ma_uint32 framesWrittenThisPeriod = 0;
                while (framesWrittenThisPeriod < periodSizeInFrames) {
                    ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                    ma_uint32 framesProcessed;
                    ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                    if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                        framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                    }

                    ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                    result = ma_device_write__pulse(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                    if (result != MA_SUCCESS) {
                        exitLoop = MA_TRUE;
                        break;
                    }

                    framesWrittenThisPeriod += framesProcessed;
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        }
    }

    /* Here is where the device needs to be stopped. */
    ma_device_stop__pulse(pDevice);

    return result;
}